

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O1

bool __thiscall ON_ArcCurve::SetEndPoint(ON_ArcCurve *this,ON_3dPoint end_point)

{
  ON_Arc *this_00;
  ON_3dVector *this_01;
  bool bVar1;
  double *pdVar2;
  ON_3dPoint *p;
  ON_3dVector *a_00;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Arc *pOVar5;
  byte bVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  ON_3dPoint start_point;
  ON_3dVector T;
  ON_3dPoint P;
  ON_Arc a;
  ON_3dVector local_130;
  double local_118;
  ON_3dPoint local_110;
  ON_3dVector local_f8;
  ON_3dPoint local_e0;
  ON_Arc local_c8;
  
  bVar6 = 0;
  bVar1 = ON_Curve::SetEndPoint(&this->super_ON_Curve,end_point);
  if (bVar1) {
    return true;
  }
  this_00 = &this->m_arc;
  bVar1 = ON_Arc::IsCircle(this_00);
  if (bVar1) {
    return false;
  }
  if (this->m_dim != 3) {
    in_XMM1_Qa = 0.0;
    if ((end_point.z != 0.0) || (NAN(end_point.z))) {
      bVar1 = false;
      goto LAB_0038c132;
    }
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_c8.super_ON_Circle.plane.origin.y = in_XMM1_Qa;
  pdVar2 = ON_Interval::operator[]((ON_Interval *)&local_c8,0);
  ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar2,&local_e0,&local_f8,0,(int *)0x0);
  pOVar4 = &ON_Plane::World_xy;
  pOVar5 = &local_c8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->super_ON_Circle).plane.origin.x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_Arc *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  local_c8.super_ON_Circle.radius = 1.0;
  local_c8.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  local_c8.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  bVar1 = ON_Arc::Create(&local_c8,&local_e0,&local_f8,&end_point);
  if (bVar1) {
    memcpy(this_00,&local_c8,0x98);
  }
  else {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_130.x = extraout_XMM0_Qa;
    local_130.y = in_XMM1_Qa;
    pdVar2 = ON_Interval::operator[]((ON_Interval *)&local_130,0);
    ON_Curve::PointAt(&local_110,&this->super_ON_Curve,*pdVar2);
    local_118 = ON_3dPoint::DistanceTo(&end_point,&local_110);
    dVar7 = ON_Circle::Radius(&this_00->super_ON_Circle);
    if (local_118 < dVar7 * 2.3283064365386963e-10) {
      p = ON_Circle::Center(&this_00->super_ON_Circle);
      ON_3dPoint::operator-(&local_130,&local_110,p);
      this_01 = &(this->m_arc).super_ON_Circle.plane.xaxis;
      (this->m_arc).super_ON_Circle.plane.xaxis.z = local_130.z;
      (this->m_arc).super_ON_Circle.plane.xaxis.x = local_130.x;
      (this->m_arc).super_ON_Circle.plane.xaxis.y = local_130.y;
      ON_3dVector::Unitize(this_01);
      a_00 = ON_Circle::Normal(&this_00->super_ON_Circle);
      ON_CrossProduct(&local_130,a_00,this_01);
      (this->m_arc).super_ON_Circle.plane.yaxis.z = local_130.z;
      (this->m_arc).super_ON_Circle.plane.yaxis.x = local_130.x;
      (this->m_arc).super_ON_Circle.plane.yaxis.y = local_130.y;
      ON_3dVector::Unitize(&(this->m_arc).super_ON_Circle.plane.yaxis);
      bVar1 = true;
      ON_Arc::SetAngleRadians(this_00,6.283185307179586);
    }
  }
  ON_Plane::~ON_Plane((ON_Plane *)&local_c8);
LAB_0038c132:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return bVar1;
}

Assistant:

bool ON_ArcCurve::SetEndPoint(ON_3dPoint end_point)
{
  if (ON_Curve::SetEndPoint(end_point))
    return true;
  if (IsCircle())
    return false;
  bool rc = false;
  if ( m_dim == 3 || end_point.z == 0.0 )
  {
    ON_3dPoint P;
    ON_3dVector T;
    double t = Domain()[0];
    Ev1Der( t, P, T );
    ON_Arc a;
    rc = a.Create( P, T, end_point );
    if ( rc )
    {
      m_arc = a;
    }
    else {
      ON_3dPoint start_point = PointAt(Domain()[0]);
      if (end_point.DistanceTo(start_point) < ON_ZERO_TOLERANCE*m_arc.Radius()){
        //make arc into circle
        m_arc.plane.xaxis = start_point - m_arc.Center();
        m_arc.plane.xaxis.Unitize();
        m_arc.plane.yaxis = ON_CrossProduct(m_arc.Normal(), m_arc.plane.xaxis);
        m_arc.plane.yaxis.Unitize();
        m_arc.SetAngleRadians(2.0*ON_PI);
        rc = true;
      }
    }
  }
	DestroyCurveTree();
  return rc;  
}